

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<unsigned_int,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  char cVar2;
  bool bVar3;
  idx_t iVar4;
  ValidityMask *result_mask;
  ValidityMask *result_data_00;
  char *pcVar5;
  ValidityMask *pVVar6;
  ValidityMask *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar7;
  uint *ldata_3;
  char *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  uint *ldata_2;
  char *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  uint *ldata_1;
  char *result_data_1;
  uint *ldata;
  char *result_data;
  Vector *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  SelectionVector *in_stack_fffffffffffffe78;
  UnifiedVectorFormat *in_stack_fffffffffffffe80;
  Vector *in_stack_fffffffffffffe88;
  Vector *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  VectorType vector_type_p;
  SelectionVector *sel_vector;
  Vector *in_stack_fffffffffffffea0;
  undefined1 uVar8;
  void *in_stack_fffffffffffffea8;
  char *result_data_01;
  ValidityMask *in_stack_fffffffffffffeb0;
  ValidityMask *in_stack_fffffffffffffeb8;
  Vector *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  uint *in_stack_fffffffffffffed0;
  UnifiedVectorFormat *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff38;
  Vector *in_stack_ffffffffffffff40;
  undefined1 local_b8 [72];
  SelectionVector *local_70;
  ValidityMask *local_68;
  ValidityMask *local_60;
  Vector *local_58;
  optional_idx local_50;
  uint *local_48;
  char *local_40;
  uint *local_38;
  char *local_30;
  char local_22;
  byte local_21;
  ValidityMask *local_18;
  Vector *local_10;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffe98 >> 0x38);
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffea0,vector_type_p);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
    local_40 = FlatVector::GetData<signed_char>((Vector *)0x20a0c8f);
    local_48 = FlatVector::GetData<unsigned_int>((Vector *)0x20a0ca4);
    FlatVector::Validity((Vector *)0x20a0ce6);
    FlatVector::Validity((Vector *)0x20a0cfb);
    ExecuteFlat<unsigned_int,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (bool)uVar8);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffea0,vector_type_p);
    uVar7 = (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
    local_30 = ConstantVector::GetData<signed_char>((Vector *)0x20a0bd6);
    local_38 = ConstantVector::GetData<unsigned_int>((Vector *)0x20a0beb);
    bVar3 = ConstantVector::IsNull((Vector *)0x20a0c00);
    if (bVar3) {
      ConstantVector::SetNull(in_stack_fffffffffffffec0,(bool)uVar8);
    }
    else {
      ConstantVector::SetNull(in_stack_fffffffffffffec0,(bool)uVar8);
      ConstantVector::Validity(local_10);
      cVar2 = UnaryOperatorWrapper::Operation<duckdb::SignOperator,unsigned_int,signed_char>
                        (uVar7,(ValidityMask *)in_stack_fffffffffffffe78,
                         CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         in_stack_fffffffffffffe68);
      *local_30 = cVar2;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_50 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe68);
      bVar3 = optional_idx::IsValid(&local_50);
      if ((bVar3) &&
         (iVar4 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffeb0),
         (ValidityMask *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0)) {
        local_58 = DictionaryVector::Child((Vector *)0x20a0da0);
        VVar1 = Vector::GetVectorType(local_58);
        if (VVar1 == FLAT_VECTOR) {
          local_60 = (ValidityMask *)FlatVector::GetData<signed_char>((Vector *)0x20a0dca);
          uVar8 = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
          result_mask = (ValidityMask *)FlatVector::GetData<unsigned_int>((Vector *)0x20a0ddf);
          pVVar6 = local_60;
          local_68 = result_mask;
          iVar4 = optional_idx::GetIndex((optional_idx *)result_mask);
          result_data_00 = FlatVector::Validity((Vector *)0x20a0e20);
          FlatVector::Validity((Vector *)0x20a0e32);
          ExecuteFlat<unsigned_int,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
                    (in_stack_fffffffffffffed0,(char *)result_data_00,iVar4,pVVar6,result_mask,
                     in_stack_fffffffffffffea8,(bool)uVar8);
          local_70 = DictionaryVector::SelVector((Vector *)0x20a0e72);
          optional_idx::GetIndex((optional_idx *)result_mask);
          Vector::Dictionary(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                             (idx_t)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          return;
        }
      }
    }
    result_data_01 = local_b8;
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe80);
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    Vector::SetVectorType(in_stack_fffffffffffffea0,vector_type_p);
    pcVar5 = FlatVector::GetData<signed_char>((Vector *)0x20a0f1a);
    uVar8 = (undefined1)((ulong)pcVar5 >> 0x38);
    UnifiedVectorFormat::GetData<unsigned_int>((UnifiedVectorFormat *)local_b8);
    sel_vector = (SelectionVector *)(local_b8 + 0x10);
    pVVar6 = FlatVector::Validity((Vector *)0x20a0f85);
    uVar7 = local_21 & 1;
    ExecuteLoop<unsigned_int,signed_char,duckdb::UnaryOperatorWrapper,duckdb::SignOperator>
              ((uint *)in_stack_fffffffffffffeb0,result_data_01,(idx_t)pVVar6,sel_vector,
               (ValidityMask *)local_b8._0_8_,local_18,in_stack_fffffffffffffec0,(bool)uVar8);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe74,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}